

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_512f7::RegisterDiskInterfaceTestReadFile::RegisterDiskInterfaceTestReadFile
          (RegisterDiskInterfaceTestReadFile *this)

{
  RegisterDiskInterfaceTestReadFile *this_local;
  
  RegisterTest(DiskInterfaceTestReadFile::Create,"DiskInterfaceTest.ReadFile");
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, ReadFile) {
  string err;
  std::string content;
  ASSERT_EQ(DiskInterface::NotFound,
            disk_.ReadFile("foobar", &content, &err));
  EXPECT_EQ("", content);
  EXPECT_NE("", err); // actual value is platform-specific
  err.clear();

  const char* kTestFile = "testfile";
  FILE* f = fopen(kTestFile, "wb");
  ASSERT_TRUE(f);
  const char* kTestContent = "test content\nok";
  fprintf(f, "%s", kTestContent);
  ASSERT_EQ(0, fclose(f));

  ASSERT_EQ(DiskInterface::Okay,
            disk_.ReadFile(kTestFile, &content, &err));
  EXPECT_EQ(kTestContent, content);
  EXPECT_EQ("", err);
}